

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitYCbCr22tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t local_c0;
  uint32_t local_bc;
  uint32_t b_8;
  uint32_t g_8;
  uint32_t r_8;
  uint32_t Cr_3;
  uint32_t Cb_3;
  uint32_t b_7;
  uint32_t g_7;
  uint32_t r_7;
  uint32_t b_6;
  uint32_t g_6;
  uint32_t r_6;
  uint32_t Cr_2;
  uint32_t Cb_2;
  uint32_t b_5;
  uint32_t g_5;
  uint32_t r_5;
  uint32_t b_4;
  uint32_t g_4;
  uint32_t r_4;
  uint32_t Cr_1;
  uint32_t Cb_1;
  uint32_t b_3;
  uint32_t g_3;
  uint32_t r_3;
  uint32_t b_2;
  uint32_t g_2;
  uint32_t r_2;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t Cr;
  uint32_t Cb;
  int32_t incr;
  uint32_t *cp2;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  Cr = toskew * 2 + w;
  _Cb = cp + (ulong)w + (long)toskew;
  cp2._4_4_ = w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  for (cp2._0_4_ = h; 1 < (uint32_t)cp2; cp2._0_4_ = (uint32_t)cp2 - 2) {
    for (w_local = cp2._4_4_; 1 < w_local; w_local = w_local - 2) {
      r = (uint32_t)pp[4];
      g = (uint32_t)pp[5];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r,g,&b,&r_1,&g_1);
      *_y_local = b | r_1 << 8 | g_1 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r,g,&b_1,&r_2,&g_2);
      _y_local[1] = b_1 | r_2 << 8 | g_2 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[2],r,g,&b_2,&r_3,&g_3);
      *_Cb = b_2 | r_3 << 8 | g_3 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[3],r,g,&b_3,&Cb_1,&Cr_1);
      _Cb[1] = b_3 | Cb_1 << 8 | Cr_1 << 0x10 | 0xff000000;
      _y_local = _y_local + 2;
      _Cb = _Cb + 2;
      pp = pp + 6;
    }
    if (w_local == 1) {
      r_4 = (uint32_t)pp[4];
      g_4 = (uint32_t)pp[5];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_4,g_4,&b_4,&r_5,&g_5);
      *_y_local = b_4 | r_5 << 8 | g_5 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[2],r_4,g_4,&b_5,&Cb_2,&Cr_2);
      *_Cb = b_5 | Cb_2 << 8 | Cr_2 << 0x10 | 0xff000000;
      _y_local = _y_local + 1;
      _Cb = _Cb + 1;
      pp = pp + 6;
    }
    _y_local = _y_local + (int)Cr;
    _Cb = _Cb + (int)Cr;
    pp = pp + (fromskew / 2) * 6;
  }
  if ((uint32_t)cp2 == 1) {
    for (w_local = cp2._4_4_; 1 < w_local; w_local = w_local - 2) {
      r_6 = (uint32_t)pp[4];
      g_6 = (uint32_t)pp[5];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_6,g_6,&b_6,&r_7,&g_7);
      *_y_local = b_6 | r_7 << 8 | g_7 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r_6,g_6,&b_7,&Cb_3,&Cr_3);
      _y_local[1] = b_7 | Cb_3 << 8 | Cr_3 << 0x10 | 0xff000000;
      _y_local = _y_local + 2;
      _Cb = _Cb + 2;
      pp = pp + 6;
    }
    if (w_local == 1) {
      r_8 = (uint32_t)pp[4];
      g_8 = (uint32_t)pp[5];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_8,g_8,&b_8,&local_bc,
                     &local_c0);
      *_y_local = b_8 | local_bc << 8 | local_c0 << 0x10 | 0xff000000;
    }
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr22tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 2) * (2 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp2[0], pp[2]);
            YCbCrtoRGB(cp2[1], pp[3]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[2]);
            cp++;
            cp2++;
            pp += 6;
        }
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
        }
    }
}